

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

ImageT<unsigned_char,_1U> * __thiscall
ImageT<unsigned_char,1u>::copyTo<ImageT<unsigned_char,1u>>
          (ImageT<unsigned_char,1u> *this,ImageT<unsigned_char,_1U> *dst,string_view swizzle)

{
  undefined8 uVar1;
  Color *pCVar2;
  Color CVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  size_t i;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  iVar4 = (**(code **)(*(long *)this + 0x30))(this,dst,swizzle._M_len);
  iVar5 = (*(dst->super_Image)._vptr_Image[6])(dst);
  if (iVar4 != iVar5) {
    __assert_fail("getComponentSize() == dst.getComponentSize()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50a,
                  "ImageT<componentType, componentCount> &ImageT<unsigned char, 1>::copyTo(DstImage &, std::string_view) [componentType = unsigned char, componentCount = 1, DstImage = ImageT<unsigned char, 1>]"
                 );
  }
  uVar6 = *(uint32_t *)(this + 8);
  if ((uVar6 != (dst->super_Image).width) ||
     (uVar8 = *(uint32_t *)(this + 0xc), uVar8 != (dst->super_Image).height)) {
    __assert_fail("width == dst.getWidth() && height == dst.getHeight()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50b,
                  "ImageT<componentType, componentCount> &ImageT<unsigned char, 1>::copyTo(DstImage &, std::string_view) [componentType = unsigned char, componentCount = 1, DstImage = ImageT<unsigned char, 1>]"
                 );
  }
  uVar1 = *(undefined8 *)(this + 0x10);
  (dst->super_Image).transferFunction = (int)uVar1;
  (dst->super_Image).primaries = (int)((ulong)uVar1 >> 0x20);
  uVar9 = 0;
  do {
    if (uVar8 * uVar6 <= uVar9) {
      return (ImageT<unsigned_char,_1U> *)this;
    }
    uVar11 = 0;
    while( true ) {
      uVar7 = (*(dst->super_Image)._vptr_Image[5])(dst);
      if (uVar7 <= uVar11) break;
      uVar7 = (**(code **)(*(long *)this + 0x28))(this);
      if (uVar7 <= uVar11) break;
      pCVar2 = dst->pixels;
      CVar3.field_0 =
           (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)
           ImageT<unsigned_char,_1U>::swizzlePixel
                     ((ImageT<unsigned_char,_1U> *)this,(Color *)(*(long *)(this + 0x18) + uVar9),
                      swizzle._M_str[uVar11]);
      pCVar2[uVar9].field_0 = CVar3.field_0;
      uVar11 = uVar11 + 1;
    }
    while( true ) {
      uVar7 = (*(dst->super_Image)._vptr_Image[5])(dst);
      uVar10 = (uint)uVar11;
      if (uVar7 <= uVar10) break;
      dst->pixels[uVar9].field_0 =
           (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)((uVar10 < 3) + -1);
      uVar11 = (ulong)(uVar10 + 1);
    }
    uVar9 = uVar9 + 1;
    uVar6 = *(uint32_t *)(this + 8);
    uVar8 = *(uint32_t *)(this + 0xc);
  } while( true );
}

Assistant:

ImageT& copyTo(DstImage& dst, std::string_view swizzle) {
        assert(getComponentSize() == dst.getComponentSize());
        assert(width == dst.getWidth() && height == dst.getHeight());

        dst.setTransferFunction(transferFunction);
        dst.setPrimaries(primaries);
        for (size_t i = 0; i < getPixelCount(); i++) {
            uint32_t c;
            for (c = 0; c < dst.getComponentCount(); c++) {
                if (c < getComponentCount())
                    dst.pixels[i].set(c, swizzlePixel(pixels[i], swizzle[c]));
                else
                    break;
            }
            for (; c < dst.getComponentCount(); c++)
                if (c < 3)
                    dst.pixels[i].set(c, componentType{0});
                else
                    dst.pixels[i].set(c, Color::one());
        }
        return *this;
    }